

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::FileError::FileError(FileError *this,string *msg)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FileError",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,msg);
  FileError(this,&local_30,&local_50,FileError);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }